

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

bool test7(void)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  unsigned_long __tmp_2;
  unsigned_long __tmp_1;
  int *__tmp;
  vector<int> v2;
  vector<int> w2;
  vector<int> local_68;
  vector<int> local_50;
  vector<int> local_38;
  vector<int> local_20;
  
  CP::vector<int>::vector(&local_50);
  CP::vector<int>::vector(&local_68);
  local_38.mData._0_4_ = 1;
  CP::vector<int>::push_back(&local_50,(int *)&local_38);
  local_38.mData._0_4_ = 2;
  CP::vector<int>::push_back(&local_50,(int *)&local_38);
  local_38.mData._0_4_ = 3;
  CP::vector<int>::push_back(&local_50,(int *)&local_38);
  local_38.mData._0_4_ = 10;
  CP::vector<int>::push_back(&local_68,(int *)&local_38);
  local_38.mData._0_4_ = 4;
  CP::vector<int>::push_back(&local_68,(int *)&local_38);
  CP::vector<int>::vector(&local_38,&local_50);
  CP::vector<int>::vector(&local_20,&local_68);
  iVar3 = 0x186a2;
  do {
    iVar3 = iVar3 + -1;
  } while (iVar3 != 0);
  bVar1 = CP::vector<int>::operator==(&local_50,&local_20);
  if (bVar1) {
    bVar1 = CP::vector<int>::operator==(&local_68,&local_38);
    bVar2 = true;
    if (bVar1) goto LAB_00101b2f;
  }
  bVar2 = false;
LAB_00101b2f:
  CP::vector<int>::~vector(&local_20);
  CP::vector<int>::~vector(&local_38);
  CP::vector<int>::~vector(&local_68);
  CP::vector<int>::~vector(&local_50);
  return bVar2;
}

Assistant:

bool test7() {
  CP::vector<int> v;
  CP::vector<int> w;
  v.push_back(1); v.push_back(2); v.push_back(3);
  w.push_back(10); w.push_back(4);

  CP::vector<int> v2(v);
  CP::vector<int> w2(w);
  for (int i = 0;i < 100001;i++)
    v.swap(w);
  if (v == w2 && w == v2) return true;
  return false;
}